

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnGetValidate(XL *out,string *val_path)

{
  HyperParam *pHVar1;
  string *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  pHVar1 = XLearn::GetHyperParam((XLearn *)*in_RDI);
  std::__cxx11::string::operator=(in_RSI,(string *)&pHVar1->validate_set_file);
  return 0;
}

Assistant:

XL_DLL int XLearnGetValidate(XL *out, std::string& val_path) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  val_path = xl->GetHyperParam().validate_set_file;
  API_END();
}